

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O2

matrix2 * matrix2_rotate(matrix2 *self,double angle)

{
  double dVar1;
  matrix2 rotationMatrix;
  anon_union_32_5_d0a4420b_for_matrix2_0 local_28;
  
  dVar1 = cos(angle);
  local_28.m[1] = sin(angle);
  local_28.m[2] = -local_28.m[1];
  local_28.m[0] = dVar1;
  local_28.m[3] = dVar1;
  matrix2_multiply(self,(matrix2 *)&local_28.field_1);
  return self;
}

Assistant:

HYPAPI struct matrix2 *matrix2_rotate(struct matrix2 *self, HYP_FLOAT angle)
{
	struct matrix2 rotationMatrix;

	return matrix2_multiply(self,
		matrix2_make_transformation_rotationf_z(&rotationMatrix, angle));
}